

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# studentGrades.cpp
# Opt level: O0

void printStudentSummary(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *studentScores,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *studentNames)

{
  char cVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  double dVar7;
  vector<double,_std::allocator<double>_> local_130;
  vector<double,_std::allocator<double>_> local_118;
  double local_100;
  double grade_1;
  vector<double,_std::allocator<double>_> local_e0;
  int local_c4;
  undefined1 local_c0 [4];
  int i_1;
  vector<double,_std::allocator<double>_> local_a8;
  double local_90;
  double grade;
  vector<double,_std::allocator<double>_> local_70;
  int local_58;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  undefined1 local_30 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  assignmentScores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *studentNames_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *studentScores_local;
  
  assignmentScores.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)studentNames;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,studentScores);
  transpose((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_30,&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  local_58 = 0;
  while( true ) {
    uVar2 = (ulong)local_58;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(studentScores);
    if (sVar3 <= uVar2) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](studentNames,(long)local_58);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)pvVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Highest score = ");
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](studentScores,(long)local_58);
    std::vector<double,_std::allocator<double>_>::vector(&local_70,pvVar6);
    dVar7 = max(&local_70);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector(&local_70);
    poVar5 = std::operator<<((ostream *)&std::cout,"Lowest score = ");
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](studentScores,(long)local_58);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&grade,pvVar6);
    dVar7 = min((vector<double,_std::allocator<double>_> *)&grade);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&grade);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](studentScores,(long)local_58);
    std::vector<double,_std::allocator<double>_>::vector(&local_a8,pvVar6);
    dVar7 = mean(&local_a8);
    std::vector<double,_std::allocator<double>_>::~vector(&local_a8);
    local_90 = dVar7;
    poVar5 = std::operator<<((ostream *)&std::cout,"Mean = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_90);
    poVar5 = std::operator<<(poVar5," Grade:");
    cVar1 = gradeLetter(local_90);
    poVar5 = std::operator<<(poVar5,cVar1);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Mean (lowest dropped) = ");
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](studentScores,(long)local_58);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_c0,pvVar6);
    dVar7 = meanLowestDropped((vector<double,_std::allocator<double>_> *)local_c0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_c0);
    poVar5 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_58 = local_58 + 1;
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"++++++++++++++++++++++++++++++++++++++++++++");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  local_c4 = 0;
  while( true ) {
    uVar2 = (ulong)local_c4;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)local_30);
    if (sVar3 <= uVar2) break;
    poVar5 = std::operator<<((ostream *)&std::cout,"Assignment: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_c4 + 1);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Highest score = ");
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_30,(long)local_c4);
    std::vector<double,_std::allocator<double>_>::vector(&local_e0,pvVar6);
    dVar7 = max(&local_e0);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector(&local_e0);
    poVar5 = std::operator<<((ostream *)&std::cout,"Lowest score = ");
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_30,(long)local_c4);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&grade_1,pvVar6);
    dVar7 = min((vector<double,_std::allocator<double>_> *)&grade_1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&grade_1);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_30,(long)local_c4);
    std::vector<double,_std::allocator<double>_>::vector(&local_118,pvVar6);
    dVar7 = mean(&local_118);
    std::vector<double,_std::allocator<double>_>::~vector(&local_118);
    local_100 = dVar7;
    poVar5 = std::operator<<((ostream *)&std::cout,"Mean = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_100);
    poVar5 = std::operator<<(poVar5," Grade:");
    cVar1 = gradeLetter(local_100);
    poVar5 = std::operator<<(poVar5,cVar1);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Mean (lowest dropped) = ");
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)local_30,(long)local_c4);
    std::vector<double,_std::allocator<double>_>::vector(&local_130,pvVar6);
    dVar7 = meanLowestDropped(&local_130);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::vector<double,_std::allocator<double>_>::~vector(&local_130);
    poVar5 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_c4 = local_c4 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_30);
  return;
}

Assistant:

void printStudentSummary(vector<vector<double>> studentScores, vector<string> studentNames) {
    vector<vector<double>> assignmentScores = transpose(studentScores);

    // PRINT STUDENT RESULTS
    for (int i = 0; i < studentScores.size(); i++) {
        cout << studentNames[i] << endl;
        cout << "Highest score = " << max(studentScores[i]) << endl;
        cout << "Lowest score = " << min(studentScores[i]) << endl;
        double grade = mean(studentScores[i]);
        cout << "Mean = " << grade << " Grade:" << gradeLetter(grade) << endl;  // finish gradeletter function.
        cout << "Mean (lowest dropped) = " << meanLowestDropped(studentScores[i]) << endl;
        cout << "-------------------------------------" << endl;
    }

    // PRINT BLANK LINES
    cout << endl;
    cout << endl;
    cout << "++++++++++++++++++++++++++++++++++++++++++++" << endl;
    cout << endl;
    cout << endl;

    // PRINT ASSIGNMENT RESULTS
    for (int i = 0; i < assignmentScores.size(); i++) {
        cout << "Assignment: " << i + 1 << endl;
        cout << "Highest score = " << max(assignmentScores[i]) << endl;
        cout << "Lowest score = " << min(assignmentScores[i]) << endl;
        double grade = mean(assignmentScores[i]);
        cout << "Mean = " << grade << " Grade:" << gradeLetter(grade) <<  endl;  // finish gradeletter function.
        cout << "Mean (lowest dropped) = " << meanLowestDropped(assignmentScores[i]) << endl;
        cout << "-------------------------------------" << endl;
    }
}